

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseImporter.cpp
# Opt level: O0

bool Assimp::BaseImporter::SearchFileHeaderForToken
               (IOSystem *pIOHandler,string *pFile,char **tokens,uint numTokens,uint searchBytes,
               bool tokensSol,bool noAlphaBeforeTokens)

{
  bool bVar1;
  int iVar2;
  IOStream *__p;
  pointer pIVar3;
  char *pcVar4;
  pointer __haystack;
  undefined4 extraout_var;
  Logger *this;
  basic_formatter *this_00;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  string local_120;
  pointer local_100;
  char *r;
  size_t tokIdx;
  char *ptr;
  size_t len;
  string local_d8 [4];
  uint i_1;
  string token;
  char *end;
  char *cur2;
  char *cur;
  size_t i;
  size_t read;
  char *buffer;
  unique_ptr<char[],_std::default_delete<char[]>_> _buffer;
  allocator local_61;
  string local_60;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> local_40;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> pStream;
  bool noAlphaBeforeTokens_local;
  bool tokensSol_local;
  uint searchBytes_local;
  uint numTokens_local;
  char **tokens_local;
  string *pFile_local;
  IOSystem *pIOHandler_local;
  
  pStream._M_t.super___uniq_ptr_impl<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>._M_t.
  super__Tuple_impl<0UL,_Assimp::IOStream_*,_std::default_delete<Assimp::IOStream>_>.
  super__Head_base<0UL,_Assimp::IOStream_*,_false>._M_head_impl._6_1_ = noAlphaBeforeTokens;
  pStream._M_t.super___uniq_ptr_impl<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>._M_t.
  super__Tuple_impl<0UL,_Assimp::IOStream_*,_std::default_delete<Assimp::IOStream>_>.
  super__Head_base<0UL,_Assimp::IOStream_*,_false>._M_head_impl._7_1_ = tokensSol;
  if (tokens == (char **)0x0) {
    __assert_fail("nullptr != tokens",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/Common/BaseImporter.cpp"
                  ,0xac,
                  "static bool Assimp::BaseImporter::SearchFileHeaderForToken(IOSystem *, const std::string &, const char **, unsigned int, unsigned int, bool, bool)"
                 );
  }
  if (numTokens == 0) {
    __assert_fail("0 != numTokens",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/Common/BaseImporter.cpp"
                  ,0xad,
                  "static bool Assimp::BaseImporter::SearchFileHeaderForToken(IOSystem *, const std::string &, const char **, unsigned int, unsigned int, bool, bool)"
                 );
  }
  if (searchBytes == 0) {
    __assert_fail("0 != searchBytes",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/Common/BaseImporter.cpp"
                  ,0xae,
                  "static bool Assimp::BaseImporter::SearchFileHeaderForToken(IOSystem *, const std::string &, const char **, unsigned int, unsigned int, bool, bool)"
                 );
  }
  if (pIOHandler == (IOSystem *)0x0) {
    pIOHandler_local._7_1_ = 0;
    goto LAB_0016807d;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,"rb",&local_61);
  __p = IOSystem::Open(pIOHandler,pFile,&local_60);
  std::unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>>::
  unique_ptr<std::default_delete<Assimp::IOStream>,void>
            ((unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>> *)&local_40,__p);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  pIVar3 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::get(&local_40)
  ;
  if (pIVar3 == (pointer)0x0) {
LAB_00168059:
    pIOHandler_local._7_1_ = 0;
  }
  else {
    pcVar4 = (char *)operator_new__((ulong)(searchBytes + 1));
    std::unique_ptr<char[],std::default_delete<char[]>>::
    unique_ptr<char*,std::default_delete<char[]>,void,bool>
              ((unique_ptr<char[],std::default_delete<char[]>> *)&buffer,pcVar4);
    __haystack = std::unique_ptr<char[],_std::default_delete<char[]>_>::get
                           ((unique_ptr<char[],_std::default_delete<char[]>_> *)&buffer);
    pIVar3 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::operator->
                       (&local_40);
    iVar2 = (*pIVar3->_vptr_IOStream[2])(pIVar3,__haystack,1,(ulong)searchBytes);
    pcVar4 = (char *)CONCAT44(extraout_var,iVar2);
    if (pcVar4 == (char *)0x0) {
      pIOHandler_local._7_1_ = 0;
      bVar1 = true;
    }
    else {
      for (cur = (char *)0x0; cur < pcVar4; cur = cur + 1) {
        iVar2 = tolower((int)__haystack[(long)cur]);
        __haystack[(long)cur] = (char)iVar2;
      }
      token.field_2._8_8_ = __haystack + (long)pcVar4;
      end = __haystack;
      for (cur2 = __haystack; cur2 != (char *)token.field_2._8_8_; cur2 = cur2 + 1) {
        if (*cur2 != '\0') {
          *end = *cur2;
          end = end + 1;
        }
      }
      *end = '\0';
      std::__cxx11::string::string(local_d8);
      for (len._4_4_ = 0; len._4_4_ < numTokens; len._4_4_ = len._4_4_ + 1) {
        if (tokens[len._4_4_] == (char *)0x0) {
          __assert_fail("nullptr != tokens[i]",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/Common/BaseImporter.cpp"
                        ,0xcf,
                        "static bool Assimp::BaseImporter::SearchFileHeaderForToken(IOSystem *, const std::string &, const char **, unsigned int, unsigned int, bool, bool)"
                       );
        }
        ptr = (char *)strlen(tokens[len._4_4_]);
        std::__cxx11::string::clear();
        tokIdx = (size_t)tokens[len._4_4_];
        for (r = (char *)0x0; r < ptr; r = r + 1) {
          tolower((int)*(char *)tokIdx);
          std::__cxx11::string::push_back((char)local_d8);
          tokIdx = tokIdx + 1;
        }
        pcVar4 = (char *)std::__cxx11::string::c_str();
        local_100 = strstr(__haystack,pcVar4);
        if (((local_100 != (char *)0x0) &&
            ((((pStream._M_t.
                super___uniq_ptr_impl<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>._M_t
                .super__Tuple_impl<0UL,_Assimp::IOStream_*,_std::default_delete<Assimp::IOStream>_>.
                super__Head_base<0UL,_Assimp::IOStream_*,_false>._M_head_impl._6_1_ & 1) == 0 ||
              (local_100 == __haystack)) || (iVar2 = isalpha((int)local_100[-1]), iVar2 == 0)))) &&
           (((((pStream._M_t.
                super___uniq_ptr_impl<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>._M_t
                .super__Tuple_impl<0UL,_Assimp::IOStream_*,_std::default_delete<Assimp::IOStream>_>.
                super__Head_base<0UL,_Assimp::IOStream_*,_false>._M_head_impl._7_1_ & 1) == 0 ||
              (local_100 == __haystack)) || (local_100[-1] == '\r')) || (local_100[-1] == '\n')))) {
          this = DefaultLogger::get();
          Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
          basic_formatter<char[42]>
                    (&local_298,(char (*) [42])"Found positive match for header keyword: ");
          this_00 = (basic_formatter *)
                    Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                    operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                              &local_298,tokens + len._4_4_);
          Formatter::basic_formatter::operator_cast_to_string(&local_120,this_00);
          Logger::debug(this,&local_120);
          std::__cxx11::string::~string((string *)&local_120);
          Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
          ~basic_formatter(&local_298);
          pIOHandler_local._7_1_ = 1;
          bVar1 = true;
          goto LAB_0016801f;
        }
      }
      bVar1 = false;
LAB_0016801f:
      std::__cxx11::string::~string(local_d8);
    }
    std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
              ((unique_ptr<char[],_std::default_delete<char[]>_> *)&buffer);
    if (!bVar1) goto LAB_00168059;
  }
  std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::~unique_ptr(&local_40);
LAB_0016807d:
  return (bool)(pIOHandler_local._7_1_ & 1);
}

Assistant:

bool BaseImporter::SearchFileHeaderForToken( IOSystem* pIOHandler,
    const std::string&  pFile,
    const char**        tokens,
    unsigned int        numTokens,
    unsigned int        searchBytes /* = 200 */,
    bool                tokensSol /* false */,
    bool                noAlphaBeforeTokens /* false */)
{
    ai_assert( nullptr != tokens );
    ai_assert( 0 != numTokens );
    ai_assert( 0 != searchBytes);

    if ( nullptr == pIOHandler ) {
        return false;
    }

    std::unique_ptr<IOStream> pStream (pIOHandler->Open(pFile));
    if (pStream.get() ) {
        // read 200 characters from the file
        std::unique_ptr<char[]> _buffer (new char[searchBytes+1 /* for the '\0' */]);
        char *buffer( _buffer.get() );
        const size_t read( pStream->Read(buffer,1,searchBytes) );
        if( 0 == read ) {
            return false;
        }

        for( size_t i = 0; i < read; ++i ) {
            buffer[ i ] = static_cast<char>( ::tolower( buffer[ i ] ) );
        }

        // It is not a proper handling of unicode files here ...
        // ehm ... but it works in most cases.
        char* cur = buffer,*cur2 = buffer,*end = &buffer[read];
        while (cur != end)  {
            if( *cur ) {
                *cur2++ = *cur;
            }
            ++cur;
        }
        *cur2 = '\0';

        std::string token;
        for (unsigned int i = 0; i < numTokens; ++i ) {
            ai_assert( nullptr != tokens[i] );
            const size_t len( strlen( tokens[ i ] ) );
            token.clear();
            const char *ptr( tokens[ i ] );
            for ( size_t tokIdx = 0; tokIdx < len; ++tokIdx ) {
                token.push_back( static_cast<char>( tolower( *ptr ) ) );
                ++ptr;
            }
            const char* r = strstr( buffer, token.c_str() );
            if( !r ) {
                continue;
            }
            // We need to make sure that we didn't accidentially identify the end of another token as our token,
            // e.g. in a previous version the "gltf " present in some gltf files was detected as "f "
            if (noAlphaBeforeTokens && (r != buffer && isalpha(r[-1]))) {
                continue;
            }
            // We got a match, either we don't care where it is, or it happens to
            // be in the beginning of the file / line
            if (!tokensSol || r == buffer || r[-1] == '\r' || r[-1] == '\n') {
                ASSIMP_LOG_DEBUG_F( "Found positive match for header keyword: ", tokens[i] );
                return true;
            }
        }
    }

    return false;
}